

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_and_recv(connectdata *conn,void **msg)

{
  CURLcode CVar1;
  int local_34;
  int local_30;
  CURLcode local_2c;
  int nread;
  CURLcode result;
  smb_conn *smbc;
  void **msg_local;
  connectdata *conn_local;
  
  _nread = &conn->proto;
  smbc = (smb_conn *)msg;
  msg_local = &conn->data;
  if (((conn->proto).ftpc.pp.sendsize == 0) && ((conn->proto).ftpc.pp.sendleft != 0)) {
    if ((conn->proto).ftpc.pp.sendleft < 0x4001) {
      local_34 = (int)(conn->proto).smbc.upload_size;
    }
    else {
      local_34 = 0x4000;
    }
    local_30 = local_34;
    (conn->data->req).upload_fromhere = (conn->data->state).uploadbuffer;
    local_2c = Curl_fillreadbuffer(conn,local_34,&local_30);
    if ((local_2c != CURLE_OK) && (local_2c != CURLE_AGAIN)) {
      return local_2c;
    }
    if (local_30 == 0) {
      return CURLE_OK;
    }
    (_nread->ftpc).pp.sendleft = (_nread->ftpc).pp.sendleft - (long)local_30;
    *(long *)((long)_nread + 0x38) = (long)local_30;
    (_nread->ftpc).pp.response.tv_sec = 0;
  }
  if ((_nread->ftpc).pp.sendsize != 0) {
    CVar1 = smb_flush((connectdata *)msg_local);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    local_2c = CURLE_OK;
  }
  if (((_nread->ftpc).pp.sendsize == 0) && ((_nread->ftpc).pp.sendleft == 0)) {
    conn_local._4_4_ = smb_recv_message((connectdata *)msg_local,(void **)smbc);
  }
  else {
    conn_local._4_4_ = CURLE_AGAIN;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smb_send_and_recv(struct connectdata *conn, void **msg)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    int nread = smbc->upload_size > UPLOAD_BUFSIZE ? UPLOAD_BUFSIZE :
      (int) smbc->upload_size;
    conn->data->req.upload_fromhere = conn->data->state.uploadbuffer;
    result = Curl_fillreadbuffer(conn, nread, &nread);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(conn);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(conn, msg);
}